

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shell.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_69c8::execute(anon_unknown_dwarf_69c8 *this,string_view command)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar5;
  string_view command_00;
  string_view command_01;
  string_view prefix;
  string_view prefix_00;
  string_view args;
  string_view local_28;
  
  command_00._len = command._ptr;
  local_28._ptr = (char *)0x0;
  local_28._len = 0;
  command_00._ptr = (char *)this;
  prefix._len = 7;
  prefix._ptr = "log w1 ";
  bVar1 = prefixed(command_00,prefix,&local_28);
  uVar4 = extraout_XMM0_Da;
  uVar5 = extraout_XMM0_Db;
  if ((bVar1) ||
     (command_01._len = (size_t)command_00._len, command_01._ptr = (char *)this, prefix_00._len = 7,
     prefix_00._ptr = "log w2 ", bVar1 = prefixed(command_01,prefix_00,&local_28),
     uVar4 = extraout_XMM0_Da_00, uVar5 = extraout_XMM0_Db_00, bVar1)) {
    log((double)CONCAT44(uVar5,uVar4));
    return;
  }
  if (command_00._len == (char *)0x4) {
    iVar2 = bcmp(this,"help",4);
    if (iVar2 == 0) goto LAB_00102815;
  }
  else if ((command_00._len == (char *)0x9) && (iVar2 = bcmp(this,"terminate",9), iVar2 == 0)) {
    std::terminate();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Unknown command ",0x10);
  poVar3 = (ostream *)std::ostream::write((char *)&std::cerr,(long)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
LAB_00102815:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "Shell -- interactive test program using Binlog\n\nReads commands from argv[1:] and standard input:\n\n  log w1 <msg>     Log <msg> using the first writer\n  log w2 <msg>     Log <msg> using the second writer\n  terminate        Forcefully terminate the application\n  help             Show this help\n\n"
             ,0x126);
  return;
}

Assistant:

void execute(mserialize::string_view command)
{
    mserialize::string_view args;

    if      (prefixed(command, "log w1 ", args)) { log(w1, args); }
    else if (prefixed(command, "log w2 ", args)) { log(w2, args); }
    else if (command == "terminate")             { terminate(); }
    else if (command == "help")                  { showHelp(); }
    else { std::cerr << "Unknown command " << command << "\n"; showHelp(); }
}